

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::OneofDescriptor::CopyTo(OneofDescriptor *this,OneofDescriptorProto *proto)

{
  ushort *puVar1;
  FeatureSet *from;
  OneofOptions *this_00;
  OneofOptions *pOVar2;
  FeatureSet *this_01;
  Arena *arena;
  string_view value;
  
  puVar1 = (ushort *)(this->all_names_).payload_;
  value._M_len = (ulong)*puVar1;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  value._M_str = (char *)((long)puVar1 + ~value._M_len);
  arena = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,arena);
  pOVar2 = this->options_;
  if (pOVar2 != (OneofOptions *)_OneofOptions_default_instance_) {
    this_00 = OneofDescriptorProto::mutable_options(proto);
    OneofOptions::CopyFrom(this_00,pOVar2);
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    pOVar2 = OneofDescriptorProto::mutable_options(proto);
    this_01 = OneofOptions::mutable_features(pOVar2);
    FeatureSet::CopyFrom(this_01,from);
    return;
  }
  return;
}

Assistant:

void OneofDescriptor::CopyTo(OneofDescriptorProto* proto) const {
  proto->set_name(name());
  if (&options() != &OneofOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}